

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

void __thiscall
Gudhi::Simplex_tree<Low_options>::rec_delete(Simplex_tree<Low_options> *this,Siblings *sib)

{
  pointer ppVar1;
  pointer ppVar2;
  
  ppVar1 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
  ppVar2 = ppVar1;
  if ((sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size != 0) {
    do {
      if (((ppVar2->second).children_)->parent_ == ppVar2->first) {
        rec_delete(this,(ppVar2->second).children_);
      }
      ppVar2 = ppVar2 + 1;
      ppVar1 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    } while (ppVar2 != ppVar1 + (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size);
  }
  if ((sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_capacity != 0) {
    operator_delete(ppVar1);
  }
  operator_delete(sib,0x28);
  return;
}

Assistant:

void rec_delete(Siblings * sib) {
    for (auto sh = sib->members().begin(); sh != sib->members().end(); ++sh) {
      if (has_children(sh)) {
        rec_delete(sh->second.children());
      }
    }
    delete sib;
  }